

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O0

void rw::ps2::convertCSM1_32(uint32 *pal)

{
  uint32 uVar1;
  uint32 tmp;
  int j;
  int i;
  uint32 *pal_local;
  
  for (tmp = 0; (int)tmp < 0x100; tmp = tmp + 1) {
    if ((tmp & 0x18) == 0x10) {
      uVar1 = pal[(int)tmp];
      pal[(int)tmp] = pal[(int)(tmp ^ 0x18)];
      pal[(int)(tmp ^ 0x18)] = uVar1;
    }
  }
  return;
}

Assistant:

static void
convertCSM1_32(uint32 *pal)
{
	int i, j;
	uint32 tmp;
	for(i = 0; i < 256; i++)
		// palette index bits 0x08 and 0x10 are flipped
		if((i & 0x18) == 0x10){
			j = i ^ 0x18;
			tmp = pal[i];
			pal[i] = pal[j];
			pal[j] = tmp;
		}
}